

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  ushort *puVar1;
  ushort uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  CostCacheInterval *cur;
  ushort *dist_array;
  CostModel *pCVar6;
  CostManager *manager;
  VP8LHistogram *p;
  long lVar7;
  CostCacheInterval *pCVar8;
  int64_t *cost;
  ushort *puVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int64_t iVar15;
  uint len;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint64_t nmemb;
  ushort *puVar19;
  bool bVar20;
  long local_d0;
  int local_c8;
  int extra_bits;
  ulong local_b0;
  ushort *local_a8;
  CostModel *local_a0;
  uint32_t *local_98;
  int local_8c;
  int code;
  byte local_80;
  PixOrCopy *local_78;
  uint64_t local_70;
  VP8LHashChain *local_68;
  uint local_5c;
  long local_58;
  VP8LBackwardRefs *local_50;
  uint32_t *local_48;
  VP8LColorCache local_40;
  
  uVar18 = ysize * xsize;
  local_70 = (uint64_t)(int)uVar18;
  local_98 = argb;
  local_8c = xsize;
  local_68 = hash_chain;
  dist_array = (ushort *)WebPSafeMalloc(local_70,2);
  if (dist_array == (ushort *)0x0) {
    uVar18 = 0;
    goto LAB_0013e27f;
  }
  iVar4 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
  if (cache_bits < 1) {
    iVar4 = 0x118;
  }
  nmemb = 1;
  local_50 = refs_src;
  pCVar6 = (CostModel *)WebPSafeCalloc(1,(long)iVar4 * 4 + 0xca8);
  manager = (CostManager *)WebPSafeCalloc(1,0x81c8);
  bVar20 = false;
  if (manager != (CostManager *)0x0 && pCVar6 != (CostModel *)0x0) {
    pCVar6->literal_ = pCVar6[1].alpha_;
    if (0 < cache_bits) {
      iVar4 = VP8LColorCacheInit(&local_40,cache_bits);
      bVar20 = false;
      if (iVar4 == 0) goto LAB_0013e0d9;
    }
    local_a0 = pCVar6;
    VP8LRefsCursorInit((VP8LRefsCursor *)&code,local_50);
    p = VP8LAllocateHistogram(cache_bits);
    if (p == (VP8LHistogram *)0x0) {
      bVar20 = false;
      VP8LFreeHistogram((VP8LHistogram *)0x0);
    }
    else {
      VP8LHistogramInit(p,cache_bits,1);
      while (pCVar6 = local_a0, _code != (PixOrCopy *)0x0) {
        VP8LHistogramAddSinglePixOrCopy(p,_code,VP8LDistanceToPlaneCode,local_8c);
        _code = _code + 1;
        if (_code == local_78) {
          VP8LRefsCursorNextBlock((VP8LRefsCursor *)&code);
        }
      }
      iVar4 = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
      if (p->palette_code_bits_ < 1) {
        iVar4 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar4,p->literal_,local_a0->literal_);
      ConvertPopulationCountTableToBitEstimates(0x100,p->red_,pCVar6->red_);
      ConvertPopulationCountTableToBitEstimates(0x100,p->blue_,pCVar6->blue_);
      ConvertPopulationCountTableToBitEstimates(0x100,p->alpha_,pCVar6->alpha_);
      local_48 = pCVar6->distance_;
      ConvertPopulationCountTableToBitEstimates(0x28,p->distance_,local_48);
      VP8LFreeHistogram(p);
      uVar14 = 0xfff;
      if ((int)uVar18 < 0xfff) {
        uVar14 = uVar18;
      }
      manager->costs_ = (int64_t *)0x0;
      manager->cache_intervals_ = (CostCacheInterval *)0x0;
      manager->head_ = (CostInterval *)0x0;
      manager->recycled_intervals_ = (CostInterval *)0x0;
      manager->count_ = 0;
      manager->dist_array_ = dist_array;
      local_a8 = dist_array;
      CostManagerInitFreeList(manager);
      uVar13 = 0;
      uVar16 = 0;
      if (0 < (int)uVar14) {
        uVar16 = (ulong)uVar14;
      }
      for (; dist_array = local_a8, uVar16 != uVar13; uVar13 = uVar13 + 1) {
        VP8LPrefixEncodeBits((int)uVar13,&code,&extra_bits);
        manager->cost_cache_[uVar13] =
             (long)extra_bits * 0x800000 + (ulong)local_a0->literal_[(long)code + 0x100];
      }
      manager->cache_intervals_size_ = 1;
      for (lVar7 = 5; lVar7 + -4 < (long)(int)uVar14; lVar7 = lVar7 + 1) {
        if (manager->cost_cache_[lVar7 + -4] != manager->cost_cache_[lVar7 + -5]) {
          nmemb = nmemb + 1;
          manager->cache_intervals_size_ = nmemb;
        }
      }
      pCVar8 = (CostCacheInterval *)WebPSafeMalloc(nmemb,0x10);
      manager->cache_intervals_ = pCVar8;
      if (pCVar8 != (CostCacheInterval *)0x0) {
        pCVar8->start_ = 0;
        pCVar8->end_ = 1;
        iVar15 = manager->cost_cache_[0];
        pCVar8->cost_ = iVar15;
        for (lVar7 = 5; lVar7 + -4 < (long)(int)uVar14; lVar7 = lVar7 + 1) {
          lVar11 = manager->cost_cache_[lVar7 + -4];
          if (lVar11 != iVar15) {
            pCVar8[1].start_ = (int)lVar7 + -4;
            pCVar8[1].cost_ = lVar11;
            pCVar8 = pCVar8 + 1;
          }
          pCVar8->end_ = (int)lVar7 + -3;
          iVar15 = lVar11;
        }
        cost = (int64_t *)WebPSafeMalloc(local_70,8);
        manager->costs_ = cost;
        if (cost != (int64_t *)0x0) {
          uVar16 = 0;
          uVar13 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar13 = uVar16;
          }
          for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
            cost[uVar16] = 0x7fffffffffffffff;
          }
          *dist_array = 0;
          local_d0 = 0;
          AddSingleLiteralWithCostModel
                    (local_98,&local_40,local_a0,0,(uint)(0 < cache_bits),0,cost,dist_array);
          local_58 = -1;
          local_c8 = -1;
          local_b0 = 0;
          uVar18 = 0xffffffff;
          uVar14 = 0xffffffff;
          for (lVar7 = 1; lVar7 < (long)local_70; lVar7 = lVar7 + 1) {
            lVar11 = manager->costs_[lVar7 + -1];
            uVar12 = local_68->offset_length_[lVar7] >> 0xc;
            len = local_68->offset_length_[lVar7] & 0xfff;
            iVar4 = (int)lVar7;
            AddSingleLiteralWithCostModel
                      (local_98,&local_40,local_a0,iVar4,(uint)(0 < cache_bits),lVar11,
                       manager->costs_,local_a8);
            local_5c = uVar12;
            if (1 < len) {
              if (uVar12 == uVar14) {
                uVar13 = local_b0 & 0xffffffff;
                if (local_c8 != 0) {
                  uVar13 = (ulong)(uVar18 + iVar4 + -2);
                }
                if ((int)uVar13 < (int)(iVar4 + len + -1)) {
                  uVar18 = 0;
                  lVar11 = local_d0;
                  do {
                    lVar10 = lVar11;
                    lVar11 = lVar10 + 1;
                    if ((int)uVar13 < lVar11) goto LAB_0013dfae;
                    uVar12 = local_68->offset_length_[lVar10 + 2];
                    uVar18 = uVar12 & 0xfff;
                  } while (uVar12 >> 0xc == uVar14);
                  uVar18 = local_68->offset_length_[lVar11] & 0xfff;
LAB_0013dfae:
                  iVar5 = (int)lVar10;
                  local_b0 = CONCAT44(local_b0._4_4_,iVar5 + 1);
                  local_c8 = 0;
                  UpdateCostAtIndex(manager,iVar5,0);
                  UpdateCostAtIndex(manager,(int)local_b0,0);
                  PushInterval(manager,manager->costs_[iVar5] + local_58,(int)local_b0,uVar18);
                  local_b0 = (ulong)(iVar5 + uVar18);
                }
                else {
                  local_c8 = 0;
                  local_b0 = uVar13;
                }
              }
              else {
                iVar5 = VP8LDistanceToPlaneCode(local_8c,uVar12);
                VP8LPrefixEncodeBits(iVar5,&code,&extra_bits);
                local_58 = (long)extra_bits * 0x800000 + (ulong)local_48[code];
                PushInterval(manager,lVar11 + local_58,iVar4,len);
                local_c8 = 1;
              }
            }
            UpdateCostAtIndex(manager,iVar4,1);
            local_d0 = local_d0 + 1;
            uVar18 = len;
            uVar14 = local_5c;
          }
          bVar20 = local_50->error_ == 0;
          dist_array = local_a8;
          goto LAB_0013e0c0;
        }
      }
      CostManagerClear(manager);
      bVar20 = false;
    }
LAB_0013e0c0:
    pCVar6 = local_a0;
    if (0 < cache_bits) {
      VP8LColorCacheClear(&local_40);
      pCVar6 = local_a0;
    }
  }
LAB_0013e0d9:
  CostManagerClear(manager);
  WebPSafeFree(pCVar6);
  WebPSafeFree(manager);
  uVar18 = 0;
  if (bVar20) {
    puVar1 = dist_array + local_70;
    puVar19 = puVar1;
    for (puVar9 = dist_array + (local_70 - 1); dist_array <= puVar9;
        puVar9 = (ushort *)((long)puVar9 - (ulong)((uint)uVar2 * 2))) {
      uVar2 = *puVar9;
      puVar19[-1] = uVar2;
      puVar19 = puVar19 + -1;
    }
    if ((cache_bits < 1) ||
       (iVar4 = VP8LColorCacheInit((VP8LColorCache *)&code,cache_bits), iVar4 != 0)) {
      uVar16 = (ulong)((long)puVar1 - (long)puVar19) >> 1;
      local_a8 = dist_array;
      VP8LClearBackwardRefs(refs_dst);
      uVar17 = 0;
      uVar13 = uVar16 & 0xffffffff;
      if ((int)uVar16 < 1) {
        uVar13 = uVar17;
      }
      uVar18 = 0;
      for (; uVar17 != uVar13; uVar17 = uVar17 + 1) {
        uVar2 = puVar19[uVar17];
        if (uVar2 == 1) {
          if (cache_bits < 1) {
LAB_0013e1b9:
            uVar14 = local_98[uVar18];
            uVar16 = 0x10000;
          }
          else {
            uVar3 = local_98[uVar18];
            uVar14 = uVar3 * 0x1e35a7bd >> (local_80 & 0x1f);
            if (((int)uVar14 < 0) ||
               (uVar16 = 0x10001, *(uint32_t *)(&_code->mode + (long)(int)uVar14 * 4) != uVar3)) {
              *(uint32_t *)(&_code->mode + (long)(int)uVar14 * 4) = uVar3;
              goto LAB_0013e1b9;
            }
          }
          VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar14 << 0x20 | uVar16));
        }
        else {
          VP8LBackwardRefsCursorAdd
                    (refs_dst,(PixOrCopy)
                              ((ulong)CONCAT42(local_68->offset_length_[uVar18] >> 0xc,uVar2) *
                               0x10000 + 2));
          if (0 < cache_bits) {
            for (uVar16 = 0; (uint)uVar2 != uVar16; uVar16 = uVar16 + 1) {
              *(uint32_t *)
               (&_code->mode +
               (long)(int)(local_98[uVar18 + uVar16] * 0x1e35a7bd >> (local_80 & 0x1f)) * 4) =
                   local_98[uVar18 + uVar16];
            }
          }
        }
        uVar18 = uVar18 + uVar2;
      }
      bVar20 = refs_dst->error_ == 0;
      dist_array = local_a8;
      if (0 < cache_bits) {
        VP8LColorCacheClear((VP8LColorCache *)&code);
        dist_array = local_a8;
      }
    }
    else {
      bVar20 = false;
    }
    uVar18 = (uint)bVar20;
  }
LAB_0013e27f:
  WebPSafeFree(dist_array);
  return uVar18;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}